

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_shl32v_m68k(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(int *)((long)d + uVar2) = *(int *)((long)a + uVar2) << (*(byte *)((long)b + uVar2) & 0x1f);
    uVar2 = uVar2 + 4;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_shl32v_m68k_cold_1();
  return;
}

Assistant:

void HELPER(gvec_shl32v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
        uint8_t sh = *(uint32_t *)((char *)b + i) & 31;
        *(uint32_t *)((char *)d + i) = *(uint32_t *)((char *)a + i) << sh;
    }
    clear_high(d, oprsz, desc);
}